

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::
call_func<std::__cxx11::string(*)(std::function<void()>const&),std::__cxx11::string,std::function<void()>const&>
          (detail *this,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_function<void_()>_ptr
          *sig,_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_function<void_()>_ptr
               **f,Function_Params *params,Type_Conversions_State *t_conversions)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Type_Conversions_State *local_30;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_function<void_()>_ptr
  **f_local;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_function<void_()>_ptr
  *sig_local;
  
  local_30 = t_conversions;
  t_conversions_local = (Type_Conversions_State *)params;
  params_local = (Function_Params *)f;
  f_local = (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_function<void_()>_ptr
             **)sig;
  sig_local = (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_function<void_()>_ptr
               *)this;
  call_func<std::__cxx11::string(*)(std::function<void()>const&),std::__cxx11::string,std::function<void()>const&,0ul>
            (&local_50,(detail *)sig,f,params,t_conversions);
  Handle_Return<std::__cxx11::string>::handle<std::__cxx11::string,void>
            ((Handle_Return<std::__cxx11::string> *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value
      call_func(Ret (*sig)(Params...), const Callable &f, const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) {
        if constexpr (std::is_same_v<Ret, void>) {
          call_func(sig, std::index_sequence_for<Params...>{}, f, params, t_conversions);
          return Handle_Return<void>::handle();
        } else {
          return Handle_Return<Ret>::handle(call_func(sig, std::index_sequence_for<Params...>{}, f, params, t_conversions));
        }
      }